

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O0

void __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::SetColorMask
          (BlendMaskStateMachine *this,GLboolean r,GLboolean g,GLboolean b,GLboolean a)

{
  size_type sVar1;
  reference pvVar2;
  uint local_18;
  uint i;
  GLboolean a_local;
  GLboolean b_local;
  GLboolean g_local;
  GLboolean r_local;
  BlendMaskStateMachine *this_local;
  
  (*this->gl->colorMask)(r,g,b,a);
  local_18 = 0;
  while( true ) {
    sVar1 = std::
            vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
            ::size(&this->state);
    if (sVar1 <= local_18) break;
    pvVar2 = std::
             vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
             ::operator[](&this->state,(ulong)local_18);
    pvVar2->mask_r = r;
    pvVar2 = std::
             vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
             ::operator[](&this->state,(ulong)local_18);
    pvVar2->mask_g = g;
    pvVar2 = std::
             vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
             ::operator[](&this->state,(ulong)local_18);
    pvVar2->mask_b = b;
    pvVar2 = std::
             vector<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
             ::operator[](&this->state,(ulong)local_18);
    pvVar2->mask_a = a;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void DrawBuffersIndexedBase::BlendMaskStateMachine::SetColorMask(glw::GLboolean r, glw::GLboolean g, glw::GLboolean b,
																 glw::GLboolean a)
{
	// all draw buffers
	gl.colorMask(r, g, b, a);
	for (unsigned int i = 0; i < state.size(); ++i)
	{
		state[i].mask_r = r;
		state[i].mask_g = g;
		state[i].mask_b = b;
		state[i].mask_a = a;
	}
}